

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setChildPtrmaps(MemPage *pPage)

{
  long lVar1;
  uint uVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  Pgno childPgno_1;
  Pgno childPgno;
  u8 *pCell;
  Pgno pgno;
  BtShared *pBt;
  int nCell;
  int i;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc0;
  u32 in_stack_ffffffffffffffc4;
  MemPage *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Pgno parent;
  undefined8 uVar5;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = *(undefined8 *)(in_RDI + 0x48);
  parent = *(Pgno *)(in_RDI + 4);
  if (*in_RDI == '\0') {
    iVar3 = btreeInitPage(in_stack_ffffffffffffffc8);
  }
  else {
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    uVar2 = (uint)*(ushort *)(in_RDI + 0x18);
    uVar4 = 0;
    for (iVar6 = 0; iVar6 < (int)uVar2; iVar6 = iVar6 + 1) {
      in_stack_ffffffffffffffc8 =
           (MemPage *)
           (*(long *)(in_RDI + 0x50) +
           (long)(int)(uint)(*(ushort *)(in_RDI + 0x1a) &
                            CONCAT11(*(undefined1 *)(*(long *)(in_RDI + 0x60) + (long)(iVar6 << 1)),
                                     *(undefined1 *)
                                      (*(long *)(in_RDI + 0x60) + 1 + (long)(iVar6 << 1)))));
      ptrmapPutOvflPtr((MemPage *)CONCAT44(parent,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,
                       (u8 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
      if (in_RDI[8] == '\0') {
        in_stack_ffffffffffffffc4 = sqlite3Get4byte(&in_stack_ffffffffffffffc8->isInit);
        ptrmapPut((BtShared *)CONCAT44(iVar6,uVar2),(Pgno)((ulong)uVar5 >> 0x20),
                  (u8)((ulong)uVar5 >> 0x18),parent,(int *)in_stack_ffffffffffffffc8);
      }
    }
    if (in_RDI[8] == '\0') {
      sqlite3Get4byte((u8 *)(*(long *)(in_RDI + 0x50) + (long)(int)((byte)in_RDI[9] + 8)));
      ptrmapPut((BtShared *)CONCAT44(iVar6,uVar2),(Pgno)((ulong)uVar5 >> 0x20),
                (u8)((ulong)uVar5 >> 0x18),parent,(int *)in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}